

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v6::detail::bigint::remove_leading_zeros(bigint *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  char *in_RAX;
  uint uVar4;
  char *unaff_RBX;
  ulong uVar5;
  
  uVar5 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar2 = (uint)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  uVar4 = 1;
  if ((int)uVar2 < 1) {
    uVar4 = uVar2;
  }
  uVar2 = uVar2 + 1;
  do {
    uVar3 = uVar4;
    if ((int)uVar5 < 2) break;
    uVar2 = uVar2 - 1;
    lVar1 = uVar5 - 1;
    uVar5 = uVar5 - 1;
    uVar3 = uVar2;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar1] == 0);
  if ((int)uVar3 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  uVar5 = (ulong)uVar3;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar5) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar5);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }